

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5DlidxIter * fts5DlidxIterInit(Fts5Index *p,int bRev,int iSegid,int iLeafPg)

{
  undefined8 *puVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  Fts5DlidxIter *pIter;
  Fts5Data *pFVar5;
  Fts5DlidxIter *pOld;
  u64 nBytes;
  int iVar6;
  long lVar7;
  ulong uVar8;
  Fts5DlidxLvl *pFVar9;
  
  if (p->rc == 0) {
    lVar7 = (long)iLeafPg + ((ulong)(uint)iSegid << 0x25) + 0x1000000000;
    iVar6 = 1;
    nBytes = 0x28;
    pOld = (Fts5DlidxIter *)0x0;
    do {
      iVar4 = sqlite3_initialize();
      if ((iVar4 != 0) ||
         (pIter = (Fts5DlidxIter *)sqlite3Realloc(pOld,nBytes), pIter == (Fts5DlidxIter *)0x0)) {
        p->rc = 7;
        pIter = pOld;
        goto LAB_001cca29;
      }
      puVar1 = (undefined8 *)((long)pIter->aLvl + (nBytes - 0x18));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pIter->aLvl + (nBytes - 0x28));
      *puVar1 = 0;
      puVar1[1] = 0;
      pFVar5 = fts5DataRead(p,lVar7);
      *(Fts5Data **)((long)pIter->aLvl + (nBytes - 0x28)) = pFVar5;
      if (pFVar5 == (Fts5Data *)0x0) {
        bVar3 = 0;
      }
      else {
        bVar3 = ~*pFVar5->p & 1;
      }
      pIter->nLvl = iVar6;
      iVar6 = iVar6 + 1;
      nBytes = nBytes + 0x20;
      lVar7 = lVar7 + 0x80000000;
      pOld = pIter;
    } while (bVar3 == 0 && p->rc == 0);
    if (p->rc == 0) {
      pIter->iSegid = iSegid;
      uVar2 = pIter->nLvl;
      uVar8 = (ulong)uVar2;
      if (bRev == 0) {
        if (0 < (int)uVar2) {
          pFVar9 = pIter->aLvl;
          lVar7 = 0;
          do {
            fts5DlidxLvlNext(pFVar9);
            lVar7 = lVar7 + 1;
            pFVar9 = pFVar9 + 1;
          } while (lVar7 < pIter->nLvl);
        }
      }
      else if (0 < (int)uVar2) {
        do {
          pFVar9 = pIter->aLvl + (uVar8 - 1);
          do {
            iVar6 = fts5DlidxLvlNext(pFVar9);
          } while (iVar6 == 0);
          pFVar9->bEof = 0;
          if ((long)uVar8 < 2) goto LAB_001cca68;
          sqlite3_free(pFVar9[-1].pData);
          pFVar9[-1].iFirstOff = 0;
          pFVar9[-1].iLeafPgno = 0;
          pFVar9[-1].iRowid = 0;
          pFVar9[-1].pData = (Fts5Data *)0x0;
          pFVar9[-1].iOff = 0;
          pFVar9[-1].bEof = 0;
          pFVar5 = fts5DataRead(p,(long)pFVar9->iLeafPgno + uVar8 * 0x80000000 +
                                  ((ulong)(uint)pIter->iSegid << 0x25) + 0xf00000000);
          pFVar9[-1].pData = pFVar5;
          uVar8 = uVar8 - 1;
        } while (p->rc == 0);
        goto LAB_001cca29;
      }
LAB_001cca68:
      if (p->rc == 0) {
        return pIter;
      }
    }
  }
  else {
    pIter = (Fts5DlidxIter *)0x0;
  }
LAB_001cca29:
  fts5DlidxIterFree(pIter);
  return (Fts5DlidxIter *)0x0;
}

Assistant:

static Fts5DlidxIter *fts5DlidxIterInit(
  Fts5Index *p,                   /* Fts5 Backend to iterate within */
  int bRev,                       /* True for ORDER BY ASC */
  int iSegid,                     /* Segment id */
  int iLeafPg                     /* Leaf page number to load dlidx for */
){
  Fts5DlidxIter *pIter = 0;
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    sqlite3_int64 nByte = sizeof(Fts5DlidxIter) + i * sizeof(Fts5DlidxLvl);
    Fts5DlidxIter *pNew;

    pNew = (Fts5DlidxIter*)sqlite3_realloc64(pIter, nByte);
    if( pNew==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      i64 iRowid = FTS5_DLIDX_ROWID(iSegid, i, iLeafPg);
      Fts5DlidxLvl *pLvl = &pNew->aLvl[i];
      pIter = pNew;
      memset(pLvl, 0, sizeof(Fts5DlidxLvl));
      pLvl->pData = fts5DataRead(p, iRowid);
      if( pLvl->pData && (pLvl->pData->p[0] & 0x0001)==0 ){
        bDone = 1;
      }
      pIter->nLvl = i+1;
    }
  }

  if( p->rc==SQLITE_OK ){
    pIter->iSegid = iSegid;
    if( bRev==0 ){
      fts5DlidxIterFirst(pIter);
    }else{
      fts5DlidxIterLast(p, pIter);
    }
  }

  if( p->rc!=SQLITE_OK ){
    fts5DlidxIterFree(pIter);
    pIter = 0;
  }

  return pIter;
}